

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawGem::Draw(CommandDrawGem *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  uint uVar1;
  FTexture *texture;
  FTexture *texture_00;
  SBarInfoCoordinate y;
  
  texture = FImageCollection::operator[](&statusBar->Images,this->chain);
  texture_00 = FImageCollection::operator[](&statusBar->Images,this->gem);
  if (texture != (FTexture *)0x0) {
    y = this->y;
    if ((this->wiggle == true) && (this->drawValue != this->goalValue)) {
      y = (SBarInfoCoordinate)((int)y + this->chainWiggle * 2);
    }
    uVar1 = (uint)((double)((uint)texture->Width * 2) / (texture->Scale).X);
    uVar1 = (uint)((double)this->drawValue *
                  ((double)(int)(((uVar1 & 1) - (this->rightPadding + this->leftPadding)) +
                                ((int)uVar1 >> 1)) / 100.0));
    DSBarInfo::DrawGraphic
              (statusBar,texture,(SBarInfoCoordinate)((uVar1 % this->chainSize) * 2 + (int)this->x),
               y,block->xOffset,block->yOffset,block->currentAlpha,block->fullScreenOffsets,false,
               false,0,false,-1);
    if (texture_00 != (FTexture *)0x0) {
      DSBarInfo::DrawGraphic
                (statusBar,texture_00,
                 (SBarInfoCoordinate)((uVar1 + this->leftPadding) * 2 + (int)this->x),y,
                 block->xOffset,block->yOffset,block->currentAlpha,block->fullScreenOffsets,
                 this->translatable,false,0,false,-1);
    }
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			FTexture *chainImg = statusBar->Images[chain];
			FTexture *gemImg = statusBar->Images[gem];
			if(chainImg == NULL)
				return;
		
			SBarInfoCoordinate drawY = y;
			if(wiggle && drawValue != goalValue) // Should only wiggle when the value doesn't equal what is being drawn.
				drawY += chainWiggle;
			int chainWidth = chainImg->GetScaledWidth();
			int offset = (int) (((double) (chainWidth-leftPadding-rightPadding)/100)*drawValue);
			statusBar->DrawGraphic(chainImg, x+(offset%chainSize), drawY, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
			if(gemImg != NULL)
				statusBar->DrawGraphic(gemImg, x+leftPadding+offset, drawY, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), translatable);
		}